

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O3

void mpc_and_uint64(uint64_t *res,uint64_t *first,uint64_t *second,uint64_t *r,view_t *view,
                   uint viewshift)

{
  ulong *puVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 1;
  do {
    lVar4 = lVar3;
    if (lVar3 == 3) {
      lVar4 = 0;
    }
    uVar2 = (second[lVar4] ^ second[lVar3 + -1]) & first[lVar3 + -1] ^
            second[lVar3 + -1] & first[lVar4] ^ r[lVar3 + -1] ^ r[lVar4];
    res[lVar3 + -1] = uVar2;
    if (viewshift == 0) {
      *(ulong *)((long)view + lVar3 * 8 + -8) = uVar2;
    }
    else {
      puVar1 = (ulong *)((long)view + lVar3 * 8 + -8);
      *puVar1 = *puVar1 ^ uVar2 >> ((ulong)viewshift & 0x3f);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return;
}

Assistant:

static void mpc_and_uint64(uint64_t* res, uint64_t const* first, uint64_t const* second,
                           uint64_t const* r, view_t* view, unsigned viewshift) {
  for (unsigned m = 0; m < SC_PROOF; ++m) {
    const unsigned j = (m + 1) % SC_PROOF;
    uint64_t tmp1    = second[m] ^ second[j];
    uint64_t tmp2    = first[j] & second[m];
    tmp1             = tmp1 & first[m];
    tmp1             = tmp1 ^ tmp2;
    tmp2             = r[m] ^ r[j];
    res[m] = tmp1 = tmp1 ^ tmp2;
    if (viewshift) {
      tmp1       = tmp1 >> viewshift;
      view->t[m] = view->t[m] ^ tmp1;
    } else {
      // on first call (viewshift == 0), view->t[0..2] == 0
      view->t[m] = tmp1;
    }
  }
}